

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  ulong in_RDX;
  ulong in_RSI;
  UnifiedVectorFormat *in_R8;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat *this;
  SelectionVector *in_stack_ffffffffffffff38;
  idx_t in_stack_ffffffffffffff40;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *in_stack_ffffffffffffff48;
  string_t *in_stack_ffffffffffffff50;
  AggregateInputData *in_stack_ffffffffffffff58;
  string_t *in_stack_ffffffffffffff60;
  SelectionVector *in_stack_ffffffffffffff70;
  ValidityMask *in_stack_ffffffffffffff78;
  ValidityMask *in_stack_ffffffffffffff80;
  UnifiedVectorFormat local_78 [16];
  UnifiedVectorFormat local_68 [56];
  UnifiedVectorFormat *local_30;
  ulong local_20;
  ulong local_18;
  
  local_30 = in_R8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&stack0xffffffffffffff40);
  duckdb::Vector::ToUnifiedFormat(local_18,local_30);
  duckdb::Vector::ToUnifiedFormat(local_20,local_30);
  UnifiedVectorFormat::GetData<duckdb::string_t>(local_78);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&stack0xffffffffffffff40);
  this = local_68;
  BinaryUpdateLoop<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}